

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

void __thiscall ArchiveEntry::ArchiveEntry(ArchiveEntry *this)

{
  ArchiveEntry *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->RunName);
  this->ExperimentValue = 0;
  this->ExperimentValueScale = 0.0;
  this->FirstRanDate = 0;
  this->TotalSamplesCollected = 0;
  this->AverageBaseline = 0.0;
  this->MinBaseline = 0.0;
  this->MinBaseline_TimeSinceEpoch = 0;
  Stat::Stat(&this->MinStats);
  this->MaxBaseline = 0.0;
  this->MaxBaseline_TimeSinceEpoch = 0;
  Stat::Stat(&this->MaxStats);
  this->CurrentBaseline = 0.0;
  this->CurrentBaseline_TimeSinceEpoch = 0;
  Stat::Stat(&this->CurrentStats);
  this->Failure = false;
  return;
}

Assistant:

static void WriteHeader(std::ostream& str)
	{
		str << "GroupName,RunName,Failure,ExperimentValue,ExperimentValueScale,FirstRanDate,TotalSamplesCollected,AverageBaseline,";
		str << "MinBaseline,MinBaselineTimeSinceEpoch,";
		str << "MinStatSize,MinStatMean,MinStatVariance,MinStatStandardDeviation,MinStatSkewness,MinStatKurtosis,";
		str << "MinStatMin,MinStatMax,";
		str << "MaxBaseline,MaxBaselineTimeSinceEpoch,";
		str << "MaxStatSize,MaxStatMean,MaxStatVariance,MaxStatStandardDeviation,MaxStatSkewness,MaxStatKurtosis,";
		str << "MaxStatMin,MaxStatMax,";
		str << "CurrentBaseline,CurrentBaselineTimeSinceEpoch,";
		str << "CurrentStatSize,CurrentStatMean,CurrentStatVariance,CurrentStatStandardDeviation,CurrentStatSkewness,CurrentStatKurtosis,";
		str << "CurrentStatMin,CurrentStatMax" << std::endl;
	}